

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCheatSheetTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheatSheet_foo_TestShell::~TEST_MockCheatSheet_foo_TestShell
          (TEST_MockCheatSheet_foo_TestShell *this)

{
  TEST_MockCheatSheet_foo_TestShell *this_local;
  
  ~TEST_MockCheatSheet_foo_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCheatSheet, foo)
{
    /* Record 2 calls to Foo. Return different values on each call */
    mock().expectOneCall("Foo")
        .withParameter("param_string", "value_string")
        .withParameter("param_int", 10)
        .andReturnValue(30);
    mock().expectOneCall("Foo")
        .ignoreOtherParameters()
        .andReturnValue(50);

    /* Call production code */
    productionCodeFooCalls();
}